

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

CURLcode base64_encode(char *table64,char *inputbuff,size_t insize,char **outptr,size_t *outlen)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  
  *outptr = (char *)0x0;
  *outlen = 0;
  if (insize == 0) {
    insize = strlen(inputbuff);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = insize + 2;
  pcVar2 = (char *)(*Curl_cmalloc)((SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) &
                                   0xfffffffffffffffe) * 2 + 1);
  pcVar3 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  for (; 2 < insize; insize = insize - 3) {
    *pcVar3 = table64[(byte)*inputbuff >> 2];
    pcVar3[1] = table64[(uint)(((byte *)inputbuff)[1] >> 4) | ((byte)*inputbuff & 3) << 4];
    pcVar3[2] = table64[(uint)(((byte *)inputbuff)[2] >> 6) + (((byte *)inputbuff)[1] & 0xf) * 4];
    pcVar3[3] = table64[((byte *)inputbuff)[2] & 0x3f];
    inputbuff = (char *)((byte *)inputbuff + 3);
    pcVar3 = pcVar3 + 4;
  }
  if (insize != 0) {
    *pcVar3 = table64[(byte)*inputbuff >> 2];
    uVar5 = ((byte)*inputbuff & 3) << 4;
    if (insize == 1) {
      pcVar3[1] = table64[uVar5];
      if (table64[0x40] == '\0') {
        pcVar3 = pcVar3 + 2;
        goto LAB_001126fa;
      }
      pcVar3[2] = table64[0x40];
      cVar4 = table64[0x40];
    }
    else {
      pcVar3[1] = table64[(byte)((byte)uVar5 | ((byte *)inputbuff)[1] >> 4)];
      pcVar3[2] = table64[(ulong)(((byte *)inputbuff)[1] & 0xf) * 4];
      cVar4 = table64[0x40];
      if (cVar4 == '\0') {
        pcVar3 = pcVar3 + 3;
        goto LAB_001126fa;
      }
    }
    pcVar3[3] = cVar4;
    pcVar3 = pcVar3 + 4;
  }
LAB_001126fa:
  *pcVar3 = '\0';
  *outptr = pcVar2;
  *outlen = (long)pcVar3 - (long)pcVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode base64_encode(const char *table64,
                              const char *inputbuff, size_t insize,
                              char **outptr, size_t *outlen)
{
  char *output;
  char *base64data;
  const unsigned char *in = (const unsigned char *)inputbuff;
  const char *padstr = &table64[64];    /* Point to padding string. */

  *outptr = NULL;
  *outlen = 0;

  if(!insize)
    insize = strlen(inputbuff);

#if SIZEOF_SIZE_T == 4
  if(insize > UINT_MAX/4)
    return CURLE_OUT_OF_MEMORY;
#endif

  base64data = output = malloc((insize + 2) / 3 * 4 + 1);
  if(!output)
    return CURLE_OUT_OF_MEMORY;

  while(insize >= 3) {
    *output++ = table64[ in[0] >> 2 ];
    *output++ = table64[ ((in[0] & 0x03) << 4) | (in[1] >> 4) ];
    *output++ = table64[ ((in[1] & 0x0F) << 2) | ((in[2] & 0xC0) >> 6) ];
    *output++ = table64[ in[2] & 0x3F ];
    insize -= 3;
    in += 3;
  }
  if(insize) {
    /* this is only one or two bytes now */
    *output++ = table64[ in[0] >> 2 ];
    if(insize == 1) {
      *output++ = table64[ ((in[0] & 0x03) << 4) ];
      if(*padstr) {
        *output++ = *padstr;
        *output++ = *padstr;
      }
    }
    else {
      /* insize == 2 */
      *output++ = table64[ ((in[0] & 0x03) << 4) | ((in[1] & 0xF0) >> 4) ];
      *output++ = table64[ ((in[1] & 0x0F) << 2) ];
      if(*padstr)
        *output++ = *padstr;
    }
  }

  /* Zero terminate */
  *output = '\0';

  /* Return the pointer to the new data (allocated memory) */
  *outptr = base64data;

  /* Return the length of the new data */
  *outlen = (size_t)(output - base64data);

  return CURLE_OK;
}